

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

_Bool smtp_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  imapstate iVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  long slnum;
  
  if (len < 4) {
    return false;
  }
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  if ((((*(byte *)((long)puVar2 + (ulong)(byte)*line * 2 + 1) & 8) != 0) &&
      ((*(byte *)((long)puVar2 + (ulong)(byte)line[1] * 2 + 1) & 8) != 0)) &&
     ((*(byte *)((long)puVar2 + (ulong)(byte)line[2] * 2 + 1) & 8) != 0)) {
    if (len == 5 || line[3] == ' ') {
      slnum = strtol(line,(char **)0x0,10);
      iVar3 = curlx_sltosi(slnum);
      if (iVar3 == 1) {
        iVar3 = 0;
      }
LAB_004886d2:
      *resp = iVar3;
      return true;
    }
    if (line[3] == '-') {
      iVar1 = (conn->proto).imapc.state;
      iVar3 = 1;
      if ((iVar1 == IMAP_LIST) || (iVar1 == IMAP_CAPABILITY)) goto LAB_004886d2;
    }
  }
  return false;
}

Assistant:

static bool smtp_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some e-mail servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    result = TRUE;
    *resp = curlx_sltosi(strtol(line, NULL, 10));

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}